

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVisitor.cpp
# Opt level: O3

void __thiscall
llvm::DWARFYAML::VisitorImpl<const_llvm::DWARFYAML::Data>::traverseDebugInfo
          (VisitorImpl<const_llvm::DWARFYAML::Data> *this)

{
  uint32_t uVar1;
  long *plVar2;
  pointer pUVar3;
  ulong uVar4;
  pointer pEVar5;
  Form FVar6;
  mapped_type *pmVar7;
  pointer pAVar8;
  long lVar9;
  raw_ostream *prVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint Size;
  Data *pDVar13;
  mapped_type mVar14;
  pointer pFVar15;
  pointer pFVar16;
  pointer pUVar17;
  const_iterator __begin0;
  pointer pEVar18;
  __hash_code __code;
  pointer pAVar19;
  ulong uVar20;
  ulong N;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  undefined1 local_118 [8];
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  abbrByteOffsetToDeclsIndex;
  ulong local_40;
  uint64_t offset;
  
  local_118 = (undefined1  [8])&abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_next_resize;
  abbrByteOffsetToDeclsIndex._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  abbrByteOffsetToDeclsIndex._M_h._M_bucket_count = 0;
  abbrByteOffsetToDeclsIndex._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  abbrByteOffsetToDeclsIndex._M_h._M_element_count._0_4_ = 0x3f800000;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._4_4_ = 0;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_next_resize = 0;
  pDVar13 = this->DebugInfo;
  pAVar8 = (pDVar13->AbbrevDecls).
           super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pDVar13->AbbrevDecls).
      super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar8) {
    mVar14 = 0;
    do {
      local_40 = pAVar8[mVar14].ListOffset;
      if (*(long **)((long)local_118 +
                    (local_40 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets) * 8) !=
          (long *)0x0) {
        plVar2 = (long *)**(long **)((long)local_118 +
                                    (local_40 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets) *
                                    8);
        uVar11 = plVar2[1];
        do {
          if (local_40 == uVar11) goto LAB_00b16730;
          plVar2 = (long *)*plVar2;
        } while ((plVar2 != (long *)0x0) &&
                (uVar11 = plVar2[1],
                uVar11 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets ==
                local_40 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets));
      }
      pmVar7 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_118,&local_40);
      *pmVar7 = mVar14;
      pDVar13 = this->DebugInfo;
LAB_00b16730:
      mVar14 = mVar14 + 1;
      pAVar8 = (pDVar13->AbbrevDecls).
               super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (mVar14 < (ulong)(((long)(pDVar13->AbbrevDecls).
                                     super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8 >> 4)
                             * -0x5555555555555555));
  }
  pUVar17 = (pDVar13->CompileUnits).
            super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (pDVar13->CompileUnits).
           super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pUVar17 == pUVar3) {
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_118);
      return;
    }
    uVar11 = (ulong)pUVar17->AbbrOffset;
    if (*(long **)((long)local_118 +
                  (uVar11 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets) * 8) == (long *)0x0)
    {
LAB_00b16cb1:
      __assert_fail("abbrByteOffsetToDeclsIndex.count(offset)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                    ,0x56,
                    "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
                   );
    }
    plVar2 = (long *)**(long **)((long)local_118 +
                                (uVar11 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets) * 8);
    uVar4 = plVar2[1];
    while (uVar4 != uVar11) {
      plVar2 = (long *)*plVar2;
      if ((plVar2 == (long *)0x0) ||
         (uVar4 = plVar2[1],
         uVar4 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets !=
         uVar11 % (ulong)abbrByteOffsetToDeclsIndex._M_h._M_buckets)) goto LAB_00b16cb1;
    }
    local_40 = uVar11;
    pmVar7 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_118,&local_40);
    uVar4 = *pmVar7;
    pAVar8 = (this->DebugInfo->AbbrevDecls).
             super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pAVar8[uVar4].ListOffset != uVar11) {
      __assert_fail("DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                    ,0x58,
                    "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
                   );
    }
    uVar11 = ((long)(this->DebugInfo->AbbrevDecls).
                    super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8 >> 4) *
             -0x5555555555555555;
    if (uVar4 < uVar11) {
      pAVar8 = pAVar8 + uVar4;
      uVar20 = uVar4;
      do {
        N = uVar20;
        if ((pAVar8->Code).value == 0) break;
        uVar20 = uVar20 + 1;
        pAVar8 = pAVar8 + 1;
        N = uVar11;
      } while (uVar11 - uVar20 != 0);
      if (uVar4 != N) {
        (*this->_vptr_VisitorImpl[5])(this,pUVar17);
        pEVar18 = (pUVar17->Entries).
                  super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pEVar5 = (pUVar17->Entries).
                 super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        offset = (uint64_t)pUVar17;
        if (pEVar18 != pEVar5) {
          do {
            (*this->_vptr_VisitorImpl[7])(this,pUVar17,pEVar18);
            uVar1 = (pEVar18->AbbrCode).value;
            if (uVar1 != 0) {
              uVar11 = (uVar1 - 1) + uVar4;
              if (uVar11 < N) {
                pFVar15 = (pEVar18->Values).
                          super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pFVar15 !=
                    (pEVar18->Values).
                    super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  pAVar8 = (this->DebugInfo->AbbrevDecls).
                           super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pAVar19 = pAVar8[uVar11].Attributes.
                            super__Vector_base<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                            ._M_impl.super__Vector_impl_data._M_start;
LAB_00b168be:
                  if (pAVar19 !=
                      pAVar8[uVar11].Attributes.
                      super__Vector_base<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    (*this->_vptr_VisitorImpl[9])(this,pAVar19,pFVar15);
                    FVar6 = pAVar19->Form;
                    pFVar16 = pFVar15;
LAB_00b168e0:
                    pFVar15 = pFVar16 + 1;
                    switch(FVar6) {
                    case DW_FORM_addr:
                      goto switchD_00b168fd_caseD_1;
                    case 2:
                    case DW_FORM_flag_present:
                    case DW_FORM_strx:
                    case DW_FORM_addrx:
                    case DW_FORM_data16:
                    case DW_FORM_implicit_const:
                    case DW_FORM_loclistx:
                    case DW_FORM_rnglistx:
                    case DW_FORM_strx3:
                    case DW_FORM_addrx3:
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_block2:
                      (*this->_vptr_VisitorImpl[0xb])
                                (this,(ulong)(*(int *)&(pFVar16->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(int *)&(pFVar16->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0xffff
                                             ));
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_block4:
                      (*this->_vptr_VisitorImpl[0xc])
                                (this,(ulong)(uint)(*(int *)&(pFVar16->BlockData).
                                                                                                                          
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  *(int *)&(pFVar16->BlockData).
                                                                                                                      
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_data2:
                    case DW_FORM_ref2:
                    case DW_FORM_strx2:
                    case DW_FORM_addrx2:
                      (*this->_vptr_VisitorImpl[0xb])(this,(ulong)(ushort)(pFVar16->Value).value);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_data4:
                    case DW_FORM_ref4:
                    case DW_FORM_ref_sup4:
                    case DW_FORM_strx4:
                    case DW_FORM_addrx4:
                      (*this->_vptr_VisitorImpl[0xc])(this,(ulong)(uint)(pFVar16->Value).value);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_data8:
                    case DW_FORM_ref8:
                    case DW_FORM_ref_sig8:
                    case DW_FORM_ref_sup8:
                      lVar9 = 0x68;
                      uVar12 = 0;
                      break;
                    case DW_FORM_string:
                      (*this->_vptr_VisitorImpl[0xf])
                                (this,(pFVar16->CStr).Data,(pFVar16->CStr).Length);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_block:
                    case DW_FORM_exprloc:
                      (*this->_vptr_VisitorImpl[0xd])
                                (this,(long)(pFVar16->BlockData).
                                            super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pFVar16->BlockData).
                                            super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                            ._M_impl.super__Vector_impl_data._M_start,1);
                      abbrByteOffsetToDeclsIndex._M_h._M_single_bucket =
                           (__node_base_ptr)
                           (pFVar16->BlockData).
                           super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_block1:
                      (*this->_vptr_VisitorImpl[10])
                                (this,(ulong)(*(int *)&(pFVar16->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(int *)&(pFVar16->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0xff))
                      ;
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_data1:
                    case DW_FORM_flag:
                    case DW_FORM_ref1:
                    case DW_FORM_strx1:
                    case DW_FORM_addrx1:
                      (*this->_vptr_VisitorImpl[10])(this,(ulong)(byte)(pFVar16->Value).value);
                      goto switchD_00b168fd_caseD_2;
                    case DW_FORM_sdata:
                      uVar12 = 1;
                      lVar9 = 0x70;
                      break;
                    case DW_FORM_strp:
                    case DW_FORM_sec_offset:
                    case DW_FORM_strp_sup:
                    case DW_FORM_line_strp:
                      goto switchD_00b168fd_caseD_e;
                    case DW_FORM_udata:
                    case DW_FORM_ref_udata:
switchD_00b168fd_caseD_f:
                      uVar12 = 1;
                      lVar9 = 0x68;
                      break;
                    case DW_FORM_ref_addr:
                      Size = (uint)(*(int *)offset == -1) * 4 + 4;
                      if (*(short *)(offset + 0x10) == 2) {
                        Size = (uint)*(byte *)(offset + 0x18);
                      }
                      goto LAB_00b1696d;
                    case DW_FORM_indirect:
                      goto switchD_00b168fd_caseD_16;
                    default:
                      if (FVar6 - 0x1f01 < 2) goto switchD_00b168fd_caseD_f;
                      if (1 < FVar6 - 0x1f20) goto switchD_00b168fd_caseD_2;
switchD_00b168fd_caseD_e:
                      Size = (uint)(*(int *)offset == -1) * 4 + 4;
                      goto LAB_00b1696d;
                    }
                    (**(code **)((long)this->_vptr_VisitorImpl + lVar9))
                              (this,(pFVar16->Value).value,uVar12);
                    goto switchD_00b168fd_caseD_2;
                  }
                }
LAB_00b16c54:
                pUVar17 = (pointer)offset;
                (*this->_vptr_VisitorImpl[8])(this,offset,pEVar18);
              }
              else {
                prVar10 = errs();
                Str.Length = 0x23;
                Str.Data = "warning: invalid abbreviation code ";
                prVar10 = raw_ostream::operator<<(prVar10,Str);
                prVar10 = raw_ostream::operator<<(prVar10,(ulong)(pEVar18->AbbrCode).value);
                Str_00.Length = 9;
                Str_00.Data = " (range: ";
                prVar10 = raw_ostream::operator<<(prVar10,Str_00);
                prVar10 = raw_ostream::operator<<(prVar10,uVar4);
                Str_01.Length = 2;
                Str_01.Data = "..";
                prVar10 = raw_ostream::operator<<(prVar10,Str_01);
                prVar10 = raw_ostream::operator<<(prVar10,N);
                Str_02.Length = 2;
                Str_02.Data = ")\n";
                raw_ostream::operator<<(prVar10,Str_02);
              }
            }
            pEVar18 = pEVar18 + 1;
          } while (pEVar18 != pEVar5);
          (*this->_vptr_VisitorImpl[6])(this,pUVar17);
        }
      }
    }
    pUVar17 = pUVar17 + 1;
  } while( true );
switchD_00b168fd_caseD_16:
  (*this->_vptr_VisitorImpl[0xd])(this,(pFVar16->Value).value,1);
  FVar6 = (Form)(pFVar16->Value).value;
  pFVar16 = pFVar15;
  goto LAB_00b168e0;
switchD_00b168fd_caseD_1:
  Size = (uint)*(byte *)(offset + 0x18);
LAB_00b1696d:
  onVariableSizeValue(this,(pFVar16->Value).value,Size);
switchD_00b168fd_caseD_2:
  pAVar19 = pAVar19 + 1;
  if (pFVar15 ==
      (pEVar18->Values).
      super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>.
      _M_impl.super__Vector_impl_data._M_finish) goto LAB_00b16c54;
  goto LAB_00b168be;
}

Assistant:

void DWARFYAML::VisitorImpl<T>::traverseDebugInfo() {
  // XXX BINARYEN: Handle multiple linked compile units, each of which can
  // refer to a different abbreviation list.
  // TODO: This code appears to assume that abbreviation codes increment by 1
  // so that lookups are linear. In LLVM output that is true, but it might not
  // be in general.
  // Create a map of [byte offset into the abbreviation section] => [index in
  // DebugInfo.AbbrevDecls]. This avoids linear search for each CU.
  std::unordered_map<size_t, size_t> abbrByteOffsetToDeclsIndex;
  for (size_t i = 0; i < DebugInfo.AbbrevDecls.size(); i++) {
    auto offset = DebugInfo.AbbrevDecls[i].ListOffset;
    // The offset is the same for all entries for the same CU, so only note the
    // first as that is where the list for the CU (that LLVM DeclSet) begins.
    // That is, DebugInfo.AbbrevDecls looks like this:
    //
    //  i  CU   Abbrev  ListOffset
    // ============================
    //  0   X     X1      150
    //  1   X     X2      150
    //  2   X     X3      150
    //           ..
    //  6   Y     Y1      260
    //  7   Y     Y2      260
    //
    // Note how multiple rows i have the same CU. All those abbrevs have the
    // same ListOffset, which is the byte offset into the abbreviation section
    // for that set of abbreviations.
    if (abbrByteOffsetToDeclsIndex.count(offset)) {
      continue;
    }
    abbrByteOffsetToDeclsIndex[offset] = i;
  }
  for (auto &Unit : DebugInfo.CompileUnits) {
    // AbbrOffset is the byte offset into the abbreviation section, which we
    // need to find among the Abbrev's ListOffsets (which are the byte offsets
    // of where that abbreviation list begins).
    // TODO: Optimize this to not be O(#CUs * #abbrevs).
    auto offset = Unit.AbbrOffset;
    assert(abbrByteOffsetToDeclsIndex.count(offset));
    size_t AbbrevStart = abbrByteOffsetToDeclsIndex[offset];
    assert(DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset);
    // Find the last entry in this abbreviation list.
    size_t AbbrevEnd = AbbrevStart;
    while (AbbrevEnd < DebugInfo.AbbrevDecls.size() &&
           DebugInfo.AbbrevDecls[AbbrevEnd].Code) {
      AbbrevEnd++;
    }
    // XXX BINARYEN If there are no abbreviations, there is nothing to
    //              do in this unit.
    if (AbbrevStart == AbbrevEnd) {
      continue;
    }
    onStartCompileUnit(Unit);
    if (Unit.Entries.empty()) { // XXX BINARYEN
      continue;
    }
    for (auto &Entry : Unit.Entries) {
      onStartDIE(Unit, Entry);
      if (Entry.AbbrCode == 0u)
        continue;
      // XXX BINARYEN valid abbreviation codes start from 1, so subtract that,
      //              and are relative to the start of the abbrev table
      auto RelativeAbbrIndex = Entry.AbbrCode - 1 + AbbrevStart;
      if (RelativeAbbrIndex >= AbbrevEnd) {
        errs() << "warning: invalid abbreviation code " << Entry.AbbrCode
               << " (range: " << AbbrevStart << ".." << AbbrevEnd << ")\n";
        continue;
      }
      auto &Abbrev = DebugInfo.AbbrevDecls[RelativeAbbrIndex];
      auto FormVal = Entry.Values.begin();
      auto AbbrForm = Abbrev.Attributes.begin();
      for (;
           FormVal != Entry.Values.end() && AbbrForm != Abbrev.Attributes.end();
           ++FormVal, ++AbbrForm) {
        onForm(*AbbrForm, *FormVal);
        dwarf::Form Form = AbbrForm->Form;
        bool Indirect;
        do {
          Indirect = false;
          switch (Form) {
          case dwarf::DW_FORM_addr:
            onVariableSizeValue(FormVal->Value, Unit.AddrSize);
            break;
          case dwarf::DW_FORM_ref_addr:
            onVariableSizeValue(FormVal->Value, getRefSize(Unit));
            break;
          case dwarf::DW_FORM_exprloc:
          case dwarf::DW_FORM_block:
            onValue((uint64_t)FormVal->BlockData.size(), true);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          case dwarf::DW_FORM_block1: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint8_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block2: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint16_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block4: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint32_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_data1:
          case dwarf::DW_FORM_ref1:
          case dwarf::DW_FORM_flag:
          case dwarf::DW_FORM_strx1:
          case dwarf::DW_FORM_addrx1:
            onValue((uint8_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data2:
          case dwarf::DW_FORM_ref2:
          case dwarf::DW_FORM_strx2:
          case dwarf::DW_FORM_addrx2:
            onValue((uint16_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data4:
          case dwarf::DW_FORM_ref4:
          case dwarf::DW_FORM_ref_sup4:
          case dwarf::DW_FORM_strx4:
          case dwarf::DW_FORM_addrx4:
            onValue((uint32_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data8:
          case dwarf::DW_FORM_ref8:
          case dwarf::DW_FORM_ref_sup8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_sdata:
            onValue((int64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_udata:
          case dwarf::DW_FORM_ref_udata:
            onValue((uint64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_string:
            onValue(FormVal->CStr);
            break;
          case dwarf::DW_FORM_indirect:
            onValue((uint64_t)FormVal->Value, true);
            Indirect = true;
            Form = static_cast<dwarf::Form>((uint64_t)FormVal->Value);
            ++FormVal;
            break;
          case dwarf::DW_FORM_strp:
          case dwarf::DW_FORM_sec_offset:
          case dwarf::DW_FORM_GNU_ref_alt:
          case dwarf::DW_FORM_GNU_strp_alt:
          case dwarf::DW_FORM_line_strp:
          case dwarf::DW_FORM_strp_sup:
            onVariableSizeValue(FormVal->Value, getOffsetSize(Unit));
            break;
          case dwarf::DW_FORM_ref_sig8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_GNU_addr_index:
          case dwarf::DW_FORM_GNU_str_index:
            onValue((uint64_t)FormVal->Value, true);
            break;
          default:
            break;
          }
        } while (Indirect);
      }
      onEndDIE(Unit, Entry);
    }
    onEndCompileUnit(Unit);
  }
}